

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomCustomWidgets::write(DomCustomWidgets *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  DomCustomWidget **ppDVar2;
  DomCustomWidget *this_00;
  undefined4 in_register_00000034;
  long lVar3;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  QVar4.field_0._4_4_ = in_register_00000034;
  QVar4.field_0._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((long)__buf + 0x10);
  if (lVar1 == 0) {
    local_50.d = (Data *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_68.size = 0;
    local_50.ptr = L"customwidgets";
    local_50.size = 0xd;
  }
  else {
    QString::toLower_helper((QString *)&local_50);
  }
  QVar4.m_size = (size_t)local_50.ptr;
  QXmlStreamWriter::writeStartElement(QVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (lVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  ppDVar2 = (this->m_customWidget).d.ptr;
  lVar1 = (this->m_customWidget).d.size;
  for (lVar3 = 0; lVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
    this_00 = *(DomCustomWidget **)((long)ppDVar2 + lVar3);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"customwidget",0xc);
    DomCustomWidget::write(this_00,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomCustomWidgets::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("customwidgets") : tagName.toLower());

    for (DomCustomWidget *v : m_customWidget)
        v->write(writer, u"customwidget"_s);

    writer.writeEndElement();
}